

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

size_t PHF::uniq<phf_string>(phf_string *k,size_t n)

{
  int iVar1;
  phf_string *ppVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  
  qsort(k,n,0x10,Uniq::cmp<phf_string>);
  ppVar2 = k + 1;
  uVar3 = 1;
  lVar4 = 0;
  do {
    if (n <= uVar3) {
      sVar5 = lVar4 + 1;
      if (n == 0) {
        sVar5 = 0;
      }
      return sVar5;
    }
    if (ppVar2->n == k[lVar4].n) {
      iVar1 = bcmp(ppVar2->p,k[lVar4].p,ppVar2->n);
      if (iVar1 != 0) goto LAB_001689a5;
    }
    else {
LAB_001689a5:
      lVar4 = lVar4 + 1;
      sVar5 = ppVar2->n;
      k[lVar4].p = ppVar2->p;
      k[lVar4].n = sVar5;
    }
    uVar3 = uVar3 + 1;
    ppVar2 = ppVar2 + 1;
  } while( true );
}

Assistant:

PHF_PUBLIC size_t PHF::uniq(key_t k[], const size_t n) {
	using namespace PHF::Uniq;
	size_t i, j;

	qsort(k, n, sizeof *k, reinterpret_cast<int(*)(const void *, const void *)>(&cmp<key_t>));

	for (i = 1, j = 0; i < n; i++) {
		if (k[i] != k[j])
			k[++j] = k[i];
	}

	return (n > 0)? j + 1 : 0;
}